

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckOr(Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  allocator local_c1;
  string local_c0;
  string local_a0;
  char *local_80;
  char *message;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(\bor\b)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"OR Usage",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  message._0_4_ = 3;
  local_80 = anon_var_dwarf_90658;
  std::__cxx11::string::string((string *)&local_a0,local_60);
  pcVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,&local_a0,&local_c0,true,0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckOr(Configuration& state,
                 const std::string& sql_statement,
                 bool& print_statement){

  std::regex pattern("(\bor\b)");
  std::string title = "OR Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Consider using an IN predicate when querying an indexed column:  "
      "The IN-list predicate can be exploited for indexed retrieval and also, "
      "the optimizer can sort the IN-list to match the sort sequence of the index, "
      "leading to more efficient retrieval. Note that the IN-list must contain only "
      "constants, or values that are constant during one execution of the query block, "
      "such as outer references. "
      "EX: SELECT s.* FROM SH.sales s WHERE s.prod_id = 14 OR s.prod_id = 17; "
      "can be rewritten as:  "
      "SELECT s.* FROM SH.sales s WHERE s.prod_id IN (14, 17);";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}